

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long
AdaptingOutputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  unsigned_long uVar1;
  void **ppvVar2;
  PaStreamCallbackTimeInfo *pPVar3;
  int iVar4;
  uint uVar5;
  void ***pppvVar6;
  long lVar7;
  PaUtilChannelDescriptor *pPVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  
  uVar12 = 0;
  do {
    if ((bp->framesInTempOutputBuffer == 0) && (*streamCallbackResult == 0)) {
      pppvVar6 = (void ***)&bp->tempOutputBuffer;
      if ((bp->userOutputIsInterleaved == 0) &&
         (uVar5 = bp->outputChannelCount, pppvVar6 = &bp->tempOutputBufferPtrs, (ulong)uVar5 != 0))
      {
        uVar10 = bp->bytesPerUserOutputSample;
        uVar1 = bp->framesPerUserBuffer;
        lVar7 = 0;
        uVar11 = 0;
        do {
          bp->tempOutputBufferPtrs[uVar11] = (void *)((long)bp->tempOutputBuffer + lVar7);
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + uVar10 * uVar1;
        } while (uVar5 != uVar11);
      }
      ppvVar2 = *pppvVar6;
      pPVar3 = bp->timeInfo;
      pPVar3->inputBufferAdcTime = 0.0;
      iVar4 = (*bp->streamCallback)
                        ((void *)0x0,ppvVar2,bp->framesPerUserBuffer,pPVar3,bp->callbackStatusFlags,
                         bp->userData);
      *streamCallbackResult = iVar4;
      if (iVar4 != 2) {
        uVar1 = bp->framesPerUserBuffer;
        auVar14._8_4_ = (int)(uVar1 >> 0x20);
        auVar14._0_8_ = uVar1;
        auVar14._12_4_ = 0x45300000;
        bp->timeInfo->outputBufferDacTime =
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->outputBufferDacTime;
        bp->framesInTempOutputBuffer = uVar1;
      }
    }
    uVar11 = bp->framesInTempOutputBuffer;
    uVar9 = framesToProcess;
    if (uVar11 == 0) {
      if (bp->outputChannelCount != 0) {
        uVar11 = 0;
        pPVar8 = hostOutputChannels;
        do {
          (*bp->outputZeroer)(pPVar8->data,pPVar8->stride,(uint)framesToProcess);
          pPVar8->data = (void *)((long)pPVar8->data +
                                 (ulong)bp->bytesPerHostOutputSample *
                                 pPVar8->stride * framesToProcess);
          uVar11 = uVar11 + 1;
          pPVar8 = pPVar8 + 1;
        } while (uVar11 < bp->outputChannelCount);
      }
    }
    else {
      if (uVar11 < framesToProcess) {
        uVar9 = uVar11;
      }
      if (bp->userOutputIsInterleaved == 0) {
        pvVar13 = (void *)((bp->framesPerUserBuffer - uVar11) * (ulong)bp->bytesPerUserOutputSample
                          + (long)bp->tempOutputBuffer);
        uVar5 = (int)bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
        uVar10 = 1;
      }
      else {
        uVar5 = bp->bytesPerUserOutputSample;
        uVar10 = bp->outputChannelCount;
        pvVar13 = (void *)((bp->framesPerUserBuffer - uVar11) * (ulong)(uVar10 * uVar5) +
                          (long)bp->tempOutputBuffer);
      }
      if (bp->outputChannelCount != 0) {
        uVar11 = 0;
        pPVar8 = hostOutputChannels;
        do {
          (*bp->outputConverter)
                    (pPVar8->data,pPVar8->stride,pvVar13,uVar10,(uint)uVar9,&bp->ditherGenerator);
          pvVar13 = (void *)((long)pvVar13 + (ulong)uVar5);
          pPVar8->data = (void *)((long)pPVar8->data +
                                 (ulong)bp->bytesPerHostOutputSample * pPVar8->stride * uVar9);
          uVar11 = uVar11 + 1;
          pPVar8 = pPVar8 + 1;
        } while (uVar11 < bp->outputChannelCount);
      }
      bp->framesInTempOutputBuffer = bp->framesInTempOutputBuffer - uVar9;
    }
    uVar12 = uVar12 + uVar9;
    framesToProcess = framesToProcess - uVar9;
  } while (framesToProcess != 0);
  return uVar12;
}

Assistant:

static unsigned long AdaptingOutputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes;  /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;

    do
    {
        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult == paContinue )
        {
            userInput = 0;

            /* setup userOutput */
            if( bp->userOutputIsInterleaved )
            {
                userOutput = bp->tempOutputBuffer;
            }
            else /* user output is not interleaved */
            {
                for( i = 0; i < bp->outputChannelCount; ++i )
                {
                    bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                            i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                }

                userOutput = bp->tempOutputBufferPtrs;
            }

            bp->timeInfo->inputBufferAdcTime = 0;

            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    bp->framesPerUserBuffer, bp->timeInfo,
                    bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* if the callback returned paAbort, we disregard its output */
            }
            else
            {
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
        }

        if( bp->framesInTempOutputBuffer > 0 )
        {
            /* convert frameCount frames from user buffer to host buffer */

            frameCount = PA_MIN_( bp->framesInTempOutputBuffer, framesToGo );

            if( bp->userOutputIsInterleaved )
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample * bp->outputChannelCount *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = bp->outputChannelCount;
                srcChannelStrideBytes = bp->bytesPerUserOutputSample;
            }
            else /* user output is not interleaved */
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = 1;
                srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
            }

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputConverter(    hostOutputChannels[i].data,
                                        hostOutputChannels[i].stride,
                                        srcBytePtr, srcSampleStrideSamples,
                                        frameCount, &bp->ditherGenerator );

                srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }

            bp->framesInTempOutputBuffer -= frameCount;
        }
        else
        {
            /* no more user data is available because the callback has returned
                paComplete or paAbort. Fill the remainder of the host buffer
                with zeros.
            */

            frameCount = framesToGo;

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;

    }while( framesToGo > 0 );

    return framesProcessed;
}